

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontAtlas::GlyphRangesBuilder::AddText(GlyphRangesBuilder *this,char *text,char *text_end)

{
  uint uVar1;
  int iVar2;
  uint c;
  uint local_2c;
  
  while( true ) {
    if (text_end == (char *)0x0) {
      uVar1 = (uint)*text;
    }
    else {
      uVar1 = (uint)(text < text_end);
    }
    if (uVar1 == 0) break;
    local_2c = 0;
    iVar2 = ImTextCharFromUtf8(&local_2c,text,text_end);
    if (iVar2 == 0) {
      return;
    }
    if (local_2c < 0x10000) {
      SetBit(this,local_2c);
    }
    text = text + iVar2;
  }
  return;
}

Assistant:

void ImFontAtlas::GlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        if (c < 0x10000)
            AddChar((ImWchar)c);
    }
}